

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::xcheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  byte *pbVar4;
  const_reference pvVar5;
  DaTrie<true,_false,_false> *in_RDX;
  Edge *in_RSI;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDI;
  Edge *unaff_retaddr;
  DaTrie<true,_false,_false> *in_stack_00000008;
  uint32_t base;
  uint32_t block_pos;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t label;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks_00;
  uint32_t in_stack_fffffffffffffffc;
  
  label = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
  blocks_00 = in_RDI;
  sVar3 = Edge::size(in_RSI);
  if (sVar3 == 1) {
    Edge::begin(in_RSI);
    uVar1 = xcheck_(in_RDX,label,in_RDI);
  }
  else if (*(int *)&in_RDI[4].super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                    _M_impl.super__Vector_impl_data._M_start == -1) {
    uVar1 = bc_size((DaTrie<true,_false,_false> *)0x1618a9);
    pbVar4 = Edge::begin(in_RSI);
    uVar1 = uVar1 ^ *pbVar4;
  }
  else {
    uVar1 = *(uint32_t *)
             &in_RDI[4].super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar2 = xcheck_in_block_(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,blocks_00);
      if (uVar2 != 0xffffffff) {
        return uVar2;
      }
      pvVar5 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDX,
                          (ulong)uVar1);
      uVar1 = pvVar5->next;
    } while (uVar1 != *(uint32_t *)
                       &in_RDI[4].
                        super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                        super__Vector_impl_data._M_start);
    uVar1 = bc_size((DaTrie<true,_false,_false> *)0x161931);
    pbVar4 = Edge::begin(in_RSI);
    uVar1 = uVar1 ^ *pbVar4;
  }
  return uVar1;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (edge.size() == 1) {
      return xcheck_(*edge.begin(), blocks);
    }

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto block_pos = head_pos_;
    do {
      auto base = xcheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return bc_size() ^ *edge.begin();
  }